

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::BlitNearestFilterConsistencyCase::compare
          (BlitNearestFilterConsistencyCase *this,Surface *reference,Surface *result)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ChannelOrder CVar7;
  bool bVar8;
  RenderTarget *pRVar9;
  ostream *poVar10;
  TestLog *pTVar11;
  uint uVar12;
  RGBA thr;
  int iVar13;
  int iVar14;
  ulong uVar15;
  Surface *pSVar16;
  uint uVar17;
  int iVar18;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  bool bVar19;
  byte bVar20;
  ChannelOrder CVar21;
  uint width;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  int dx;
  ulong uVar28;
  RGBA cellColorA;
  RGBA cellColorB;
  Surface errorMask;
  bool local_48d;
  RGBA local_484;
  uint local_480;
  RGBA local_47c;
  ulong local_478;
  uint local_470;
  uint local_46c;
  ulong local_468;
  ulong local_460;
  Surface *local_458;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  Surface local_3d0;
  BlitNearestFilterConsistencyCase *local_3b8;
  ulong local_3b0;
  string local_3a8;
  string local_388;
  LogImageSet local_368;
  vector<bool,_std::allocator<bool>_> local_328;
  vector<bool,_std::allocator<bool>_> local_300;
  LogImage local_2d8;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  tcu::RGBA::RGBA(&local_484,&(this->super_BlitRectCase).m_gridCellColorA);
  tcu::RGBA::RGBA(&local_47c,&(this->super_BlitRectCase).m_gridCellColorB);
  pRVar9 = Context::getRenderTarget
                     ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.m_context);
  iVar18 = (pRVar9->m_pixelFormat).alphaBits;
  uVar26 = 0x1000000 << (8U - (char)iVar18 & 0x1f);
  bVar20 = 8 - (char)(pRVar9->m_pixelFormat).redBits;
  if (iVar18 < 1) {
    uVar26 = 0;
  }
  uVar25 = 0x100 << (8U - (char)(pRVar9->m_pixelFormat).greenBits & 0x1f) | 1 << (bVar20 & 0x1f);
  uVar26 = 0x10000 << (8U - (char)(pRVar9->m_pixelFormat).blueBits & 0x1f) | uVar25 | uVar26;
  uVar24 = 1 << (bVar20 & 0x1f) & 0xff;
  if (0xf7 < uVar24) {
    uVar24 = 0xf8;
  }
  uVar25 = uVar25 >> 8 & 0xff;
  if (0xf7 < uVar25) {
    uVar25 = 0xf8;
  }
  uVar12 = uVar26 >> 0x10 & 0xff;
  if (0xf7 < uVar12) {
    uVar12 = 0xf8;
  }
  uVar26 = uVar26 >> 0x18;
  if (0xf7 < uVar26) {
    uVar26 = 0xf8;
  }
  uVar3 = (this->super_BlitRectCase).m_dstRect.m_data[2];
  uVar17 = (this->super_BlitRectCase).m_dstRect.m_data[0];
  uVar4 = (this->super_BlitRectCase).m_dstRect.m_data[1];
  uVar5 = (this->super_BlitRectCase).m_dstRect.m_data[3];
  uVar6 = uVar5;
  if ((int)uVar4 < (int)uVar5) {
    uVar6 = uVar4;
  }
  if ((int)uVar5 < (int)uVar4) {
    uVar5 = uVar4;
  }
  uVar4 = uVar3;
  if ((int)uVar17 < (int)uVar3) {
    uVar4 = uVar17;
  }
  width = result->m_width;
  if ((int)uVar3 < (int)uVar17) {
    uVar3 = uVar17;
  }
  uVar17 = width;
  if ((int)uVar4 < (int)width) {
    uVar17 = uVar4;
  }
  local_468 = (ulong)uVar17;
  uVar17 = result->m_height;
  if ((int)uVar4 < 0) {
    local_468 = 0;
  }
  uVar4 = uVar17;
  if ((int)uVar6 < (int)uVar17) {
    uVar4 = uVar6;
  }
  local_478 = (ulong)uVar4;
  if ((int)uVar6 < 0) {
    local_478 = 0;
  }
  local_46c = width;
  if ((int)uVar3 < (int)width) {
    local_46c = uVar3;
  }
  thr.m_value = (uVar12 << 0x10 | uVar25 << 8 | uVar24) + uVar26 * 0x1000000 + 0x7070707;
  if ((int)uVar3 < 0) {
    local_46c = 0;
  }
  uVar26 = uVar17;
  if ((int)uVar5 < (int)uVar17) {
    uVar26 = uVar5;
  }
  if ((int)uVar5 < 0) {
    uVar26 = 0;
  }
  uVar24 = *(uint *)((long)(result->m_pixels).m_ptr +
                    (long)(int)((int)local_478 * width + (int)local_468) * 4);
  local_48d = true;
  if (uVar24 != local_484.m_value) {
    CVar21 = (uVar24 & 0xff) - (local_484.m_value & 0xff);
    CVar7 = -CVar21;
    if (0 < (int)CVar21) {
      CVar7 = CVar21;
    }
    iVar22 = (uVar24 >> 8 & 0xff) - (local_484.m_value >> 8 & 0xff);
    iVar18 = -iVar22;
    if (0 < iVar22) {
      iVar18 = iVar22;
    }
    iVar23 = (uVar24 >> 0x10 & 0xff) - (local_484.m_value >> 0x10 & 0xff);
    iVar22 = -iVar23;
    if (0 < iVar23) {
      iVar22 = iVar23;
    }
    iVar13 = (uVar24 >> 0x18) - (local_484.m_value >> 0x18);
    iVar23 = -iVar13;
    if (0 < iVar13) {
      iVar23 = iVar13;
    }
    local_1b0._0_4_ = iVar22 << 0x10 | iVar18 << 8 | iVar23 << 0x18 | CVar7;
    local_48d = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
    width = result->m_width;
    uVar17 = result->m_height;
  }
  tcu::Surface::Surface(&local_3d0,width,uVar17);
  local_480 = local_46c - (int)local_468;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_328,(long)(int)local_480,(bool *)local_1b0,(allocator_type *)&local_2d8);
  uVar26 = uVar26 - (int)local_478;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_300,(long)(int)uVar26,(bool *)local_1b0,(allocator_type *)&local_2d8);
  local_2d8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_3d0.m_pixels.m_cap != (void *)0x0) {
    local_3d0.m_pixels.m_cap = (size_t)local_3d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d8,local_3d0.m_width,
             local_3d0.m_height,1,(void *)local_3d0.m_pixels.m_cap);
  local_2d8.m_name._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_2d8.m_name._M_string_length = 0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(Vec4 *)&local_2d8);
  local_1b0._0_8_ =
       ((this->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying consistency of NEAREST filtering. Verifying rect ",0x3b);
  tcu::operator<<((ostream *)poVar1,&(this->super_BlitRectCase).m_dstRect);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
             ,0x79);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
             ,0x62);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_3b8 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  uVar24 = 0;
  local_470 = uVar26;
  local_458 = result;
  if ((int)uVar26 < 1) {
    bVar19 = false;
  }
  else {
    uVar15 = local_478 & 0xffffffff;
    bVar19 = false;
    do {
      local_3b0 = CONCAT44(local_3b0._4_4_,uVar24);
      uVar27 = local_468 & 0xffffffff;
      iVar18 = (int)uVar15;
      local_460 = CONCAT44(local_460._4_4_,iVar18);
      if (0 < (int)local_480) {
        do {
          iVar22 = (int)uVar27;
          uVar26 = *(uint *)((long)(result->m_pixels).m_ptr +
                            (long)(result->m_width * (int)uVar15 + iVar22) * 4);
          if (uVar26 != local_484.m_value) {
            CVar21 = (uVar26 & 0xff) - (local_484.m_value & 0xff);
            CVar7 = -CVar21;
            if (0 < (int)CVar21) {
              CVar7 = CVar21;
            }
            uVar24 = uVar26 >> 8 & 0xff;
            iVar23 = uVar24 - (local_484.m_value >> 8 & 0xff);
            iVar18 = -iVar23;
            if (0 < iVar23) {
              iVar18 = iVar23;
            }
            uVar25 = uVar26 >> 0x10 & 0xff;
            iVar13 = uVar25 - (local_484.m_value >> 0x10 & 0xff);
            iVar23 = -iVar13;
            if (0 < iVar13) {
              iVar23 = iVar13;
            }
            iVar14 = (uVar26 >> 0x18) - (local_484.m_value >> 0x18);
            iVar13 = -iVar14;
            if (0 < iVar14) {
              iVar13 = iVar14;
            }
            local_1b0._0_4_ = iVar23 << 0x10 | iVar18 << 8 | iVar13 << 0x18 | CVar7;
            bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
            if ((bVar8) || (uVar26 == local_47c.m_value)) {
              uVar15 = local_460 & 0xffffffff;
              result = local_458;
            }
            else {
              CVar21 = (uVar26 & 0xff) - (local_47c.m_value & 0xff);
              CVar7 = -CVar21;
              if (0 < (int)CVar21) {
                CVar7 = CVar21;
              }
              iVar23 = uVar24 - (local_47c.m_value >> 8 & 0xff);
              iVar18 = -iVar23;
              if (0 < iVar23) {
                iVar18 = iVar23;
              }
              iVar13 = uVar25 - (local_47c.m_value >> 0x10 & 0xff);
              iVar23 = -iVar13;
              if (0 < iVar13) {
                iVar23 = iVar13;
              }
              iVar14 = (uVar26 >> 0x18) - (local_47c.m_value >> 0x18);
              iVar13 = -iVar14;
              if (0 < iVar14) {
                iVar13 = iVar14;
              }
              local_1b0._0_4_ = iVar23 << 0x10 | iVar18 << 8 | iVar13 << 0x18 | CVar7;
              bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
              uVar15 = local_460 & 0xffffffff;
              result = local_458;
              if (!bVar8) {
                *(undefined4 *)
                 ((long)local_3d0.m_pixels.m_ptr +
                 (long)(local_3d0.m_width * (int)local_460 + iVar22) * 4) = 0xff0000ff;
                bVar19 = true;
              }
            }
          }
          iVar18 = (int)uVar15;
          uVar27 = (ulong)(iVar22 + 1U);
        } while (local_46c != iVar22 + 1U);
      }
      uVar24 = (int)local_3b0 + 1;
      uVar15 = (ulong)(iVar18 + 1);
    } while (uVar24 != local_470);
    if (bVar19) {
      local_1b0._0_8_ =
           ((local_3b8->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Image verification failed, destination rect contains unexpected values. ",0x48);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expected either ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
      poVar10 = (ostream *)std::ostream::operator<<(poVar1,local_484.m_value & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_484.m_value >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_484.m_value >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_484.m_value >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," or ",4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
      poVar10 = (ostream *)std::ostream::operator<<(poVar1,local_47c.m_value & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_47c.m_value >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_47c.m_value >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_47c.m_value >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,".",1);
      pTVar11 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Result","");
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_430,"Image verification result","");
      tcu::LogImageSet::LogImageSet(&local_368,&local_410,&local_430);
      tcu::TestLog::startImageSet
                (pTVar11,local_368.m_name._M_dataplus._M_p,local_368.m_description._M_dataplus._M_p)
      ;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Result","");
      tcu::LogImage::LogImage
                (&local_2d8,&local_450,&local_3f0,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2d8,(int)pTVar11,__buf,(size_t)result);
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ErrorMask","");
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Error mask","");
      pSVar16 = &local_3d0;
      tcu::LogImage::LogImage
                (&local_240,&local_388,&local_3a8,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,(int)pTVar11,__buf_00,(size_t)pSVar16);
      tcu::TestLog::endImageSet(pTVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
        operator_delete(local_240.m_name._M_dataplus._M_p,
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
        operator_delete(local_2d8.m_description._M_dataplus._M_p,
                        local_2d8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
        operator_delete(local_2d8.m_name._M_dataplus._M_p,
                        local_2d8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.m_description._M_dataplus._M_p != &local_368.m_description.field_2) {
        operator_delete(local_368.m_description._M_dataplus._M_p,
                        local_368.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
        operator_delete(local_368.m_name._M_dataplus._M_p,
                        local_368.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      bVar19 = false;
      goto LAB_012c2d29;
    }
  }
  if (0 < (int)local_480) {
    uVar15 = 0;
    do {
      uVar26 = *(uint *)((long)(result->m_pixels).m_ptr +
                        (long)(result->m_width * (int)local_478 + (int)local_468 + (int)uVar15) * 4)
      ;
      if (uVar26 == local_484.m_value) {
LAB_012c237f:
        local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] =
             local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] | 1L << ((byte)uVar15 & 0x3f);
      }
      else {
        CVar21 = (uVar26 & 0xff) - (local_484.m_value & 0xff);
        CVar7 = -CVar21;
        if (0 < (int)CVar21) {
          CVar7 = CVar21;
        }
        uVar24 = uVar26 >> 8 & 0xff;
        iVar22 = uVar24 - (local_484.m_value >> 8 & 0xff);
        iVar18 = -iVar22;
        if (0 < iVar22) {
          iVar18 = iVar22;
        }
        uVar25 = uVar26 >> 0x10 & 0xff;
        iVar23 = uVar25 - (local_484.m_value >> 0x10 & 0xff);
        iVar22 = -iVar23;
        if (0 < iVar23) {
          iVar22 = iVar23;
        }
        iVar13 = (uVar26 >> 0x18) - (local_484.m_value >> 0x18);
        iVar23 = -iVar13;
        if (0 < iVar13) {
          iVar23 = iVar13;
        }
        local_1b0._0_4_ = iVar22 << 0x10 | iVar18 << 8 | iVar23 << 0x18 | CVar7;
        bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
        if (bVar8) goto LAB_012c237f;
        if (uVar26 == local_47c.m_value) {
LAB_012c2430:
          bVar20 = (byte)uVar15 & 0x3f;
          local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] =
               local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] &
               (-2L << bVar20 | 0xfffffffffffffffeU >> 0x40 - bVar20);
        }
        else {
          CVar21 = (uVar26 & 0xff) - (local_47c.m_value & 0xff);
          CVar7 = -CVar21;
          if (0 < (int)CVar21) {
            CVar7 = CVar21;
          }
          iVar22 = uVar24 - (local_47c.m_value >> 8 & 0xff);
          iVar18 = -iVar22;
          if (0 < iVar22) {
            iVar18 = iVar22;
          }
          iVar23 = uVar25 - (local_47c.m_value >> 0x10 & 0xff);
          iVar22 = -iVar23;
          if (0 < iVar23) {
            iVar22 = iVar23;
          }
          iVar13 = (uVar26 >> 0x18) - (local_47c.m_value >> 0x18);
          iVar23 = -iVar13;
          if (0 < iVar13) {
            iVar23 = iVar13;
          }
          local_1b0._0_4_ = iVar22 << 0x10 | iVar18 << 8 | iVar23 << 0x18 | CVar7;
          bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
          if (bVar8) goto LAB_012c2430;
        }
      }
      uVar26 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar26;
      result = local_458;
    } while (local_480 != uVar26);
  }
  if (0 < (int)local_470) {
    uVar15 = 0;
    do {
      uVar26 = *(uint *)((long)(result->m_pixels).m_ptr +
                        (long)(((int)local_478 + (int)uVar15) * result->m_width + (int)local_468) *
                        4);
      if (uVar26 == local_484.m_value) {
LAB_012c251a:
        local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] =
             local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] | 1L << ((byte)uVar15 & 0x3f);
      }
      else {
        CVar21 = (uVar26 & 0xff) - (local_484.m_value & 0xff);
        CVar7 = -CVar21;
        if (0 < (int)CVar21) {
          CVar7 = CVar21;
        }
        uVar24 = uVar26 >> 8 & 0xff;
        iVar22 = uVar24 - (local_484.m_value >> 8 & 0xff);
        iVar18 = -iVar22;
        if (0 < iVar22) {
          iVar18 = iVar22;
        }
        uVar25 = uVar26 >> 0x10 & 0xff;
        iVar23 = uVar25 - (local_484.m_value >> 0x10 & 0xff);
        iVar22 = -iVar23;
        if (0 < iVar23) {
          iVar22 = iVar23;
        }
        iVar13 = (uVar26 >> 0x18) - (local_484.m_value >> 0x18);
        iVar23 = -iVar13;
        if (0 < iVar13) {
          iVar23 = iVar13;
        }
        local_1b0._0_4_ = iVar22 << 0x10 | iVar18 << 8 | iVar23 << 0x18 | CVar7;
        bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
        if (bVar8) goto LAB_012c251a;
        if (uVar26 == local_47c.m_value) {
LAB_012c25cd:
          bVar20 = (byte)uVar15 & 0x3f;
          local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] =
               local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] &
               (-2L << bVar20 | 0xfffffffffffffffeU >> 0x40 - bVar20);
        }
        else {
          CVar21 = (uVar26 & 0xff) - (local_47c.m_value & 0xff);
          CVar7 = -CVar21;
          if (0 < (int)CVar21) {
            CVar7 = CVar21;
          }
          iVar22 = uVar24 - (local_47c.m_value >> 8 & 0xff);
          iVar18 = -iVar22;
          if (0 < iVar22) {
            iVar18 = iVar22;
          }
          iVar23 = uVar25 - (local_47c.m_value >> 0x10 & 0xff);
          iVar22 = -iVar23;
          if (0 < iVar23) {
            iVar22 = iVar23;
          }
          iVar13 = (uVar26 >> 0x18) - (local_47c.m_value >> 0x18);
          iVar23 = -iVar13;
          if (0 < iVar13) {
            iVar23 = iVar13;
          }
          local_1b0._0_4_ = iVar22 << 0x10 | iVar18 << 8 | iVar23 << 0x18 | CVar7;
          bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
          if (bVar8) goto LAB_012c25cd;
        }
      }
      result = local_458;
      uVar26 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar26;
    } while (local_470 != uVar26);
    if (0 < (int)local_470) {
      local_3b0 = (ulong)local_470;
      uVar15 = 0;
      do {
        local_460 = uVar15;
        if (0 < (int)local_480) {
          uVar27 = 0;
          uVar28 = local_468 & 0xffffffff;
          do {
            iVar18 = (int)uVar28;
            uVar26 = *(uint *)((long)(result->m_pixels).m_ptr +
                              (long)(result->m_width * (int)local_478 + iVar18) * 4);
            bVar8 = true;
            if (local_484.m_value != uVar26) {
              CVar21 = (local_484.m_value & 0xff) - (uVar26 & 0xff);
              CVar7 = -CVar21;
              if (0 < (int)CVar21) {
                CVar7 = CVar21;
              }
              iVar23 = (local_484.m_value >> 8 & 0xff) - (uVar26 >> 8 & 0xff);
              iVar22 = -iVar23;
              if (0 < iVar23) {
                iVar22 = iVar23;
              }
              iVar13 = (local_484.m_value >> 0x10 & 0xff) - (uVar26 >> 0x10 & 0xff);
              iVar23 = -iVar13;
              if (0 < iVar13) {
                iVar23 = iVar13;
              }
              iVar14 = (local_484.m_value >> 0x18) - (uVar26 >> 0x18);
              iVar13 = -iVar14;
              if (0 < iVar14) {
                iVar13 = iVar14;
              }
              local_1b0._0_4_ = iVar23 << 0x10 | iVar22 << 8 | iVar13 << 0x18 | CVar7;
              bVar8 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,thr);
            }
            if (bVar8 == (bool)(((local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                  [uVar15 >> 6 & 0x3ffffff] & 1L << ((byte)uVar15 & 0x3f)) == 0) !=
                                ((local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                  [uVar27 >> 6] >> (uVar27 & 0x3f) & 1) != 0) ^ local_48d)) {
              *(undefined4 *)
               ((long)local_3d0.m_pixels.m_ptr +
               (long)(local_3d0.m_width * (int)local_478 + iVar18) * 4) = 0xff0000ff;
              bVar19 = true;
            }
            uVar27 = (ulong)((int)uVar27 + 1);
            uVar28 = (ulong)(iVar18 + 1U);
          } while (local_46c != iVar18 + 1U);
        }
        uVar15 = local_460 + 1;
        local_478 = (ulong)((int)local_478 + 1);
      } while (uVar15 != local_3b0);
    }
  }
  if (bVar19 == false) {
    local_1b0._0_8_ =
         ((local_3b8->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Image verification passed.",0x1a);
    pTVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    paVar2 = &local_368.m_name.field_2;
    local_368.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Result","");
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_410,"Image verification result","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_368.m_name,&local_410);
    tcu::TestLog::startImageSet
              (pTVar11,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Result","");
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
    tcu::LogImage::LogImage(&local_2d8,&local_430,&local_450,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d8,(int)pTVar11,__buf_03,(size_t)result);
    tcu::TestLog::endImageSet(pTVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
      operator_delete(local_2d8.m_description._M_dataplus._M_p,
                      local_2d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
      operator_delete(local_2d8.m_name._M_dataplus._M_p,
                      local_2d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_368.m_name._M_dataplus._M_p,
                      local_368.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_1b0._0_8_ =
         ((local_3b8->super_BlitRectCase).super_FboTestCase.super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "Image verification failed, nearest filter is not consistent.",0x3c);
    pTVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"Result","");
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_430,"Image verification result","");
    tcu::LogImageSet::LogImageSet(&local_368,&local_410,&local_430);
    tcu::TestLog::startImageSet
              (pTVar11,local_368.m_name._M_dataplus._M_p,local_368.m_description._M_dataplus._M_p);
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"Result","");
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Result","");
    tcu::LogImage::LogImage(&local_2d8,&local_450,&local_3f0,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d8,(int)pTVar11,__buf_01,(size_t)result);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ErrorMask","");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Error mask","");
    pSVar16 = &local_3d0;
    tcu::LogImage::LogImage(&local_240,&local_388,&local_3a8,pSVar16,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_240,(int)pTVar11,__buf_02,(size_t)pSVar16);
    tcu::TestLog::endImageSet(pTVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
      operator_delete(local_2d8.m_description._M_dataplus._M_p,
                      local_2d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
      operator_delete(local_2d8.m_name._M_dataplus._M_p,
                      local_2d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_description._M_dataplus._M_p != &local_368.m_description.field_2) {
      operator_delete(local_368.m_description._M_dataplus._M_p,
                      local_368.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
      operator_delete(local_368.m_name._M_dataplus._M_p,
                      local_368.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  bVar19 = (bool)(bVar19 ^ 1);
LAB_012c2d29:
  if (local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_328.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  }
  tcu::Surface::~Surface(&local_3d0);
  return bVar19;
}

Assistant:

bool BlitNearestFilterConsistencyCase::compare (const tcu::Surface& reference, const tcu::Surface& result)
{
	DE_ASSERT(reference.getWidth() == result.getWidth());
	DE_ASSERT(reference.getHeight() == result.getHeight());
	DE_UNREF(reference);

	// Image origin must be visible (for baseColor)
	DE_ASSERT(de::min(m_dstRect.x(), m_dstRect.z()) >= 0);
	DE_ASSERT(de::min(m_dstRect.y(), m_dstRect.w()) >= 0);

	const tcu::RGBA		cellColorA		(m_gridCellColorA);
	const tcu::RGBA		cellColorB		(m_gridCellColorB);
	const tcu::RGBA		threshold		= TestCase::m_context.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(7,7,7,7);
	const tcu::IVec4	destinationArea	= tcu::IVec4(de::clamp(de::min(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::min(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()),
													 de::clamp(de::max(m_dstRect.x(), m_dstRect.z()), 0, result.getWidth()),
													 de::clamp(de::max(m_dstRect.y(), m_dstRect.w()), 0, result.getHeight()));
	const tcu::RGBA		baseColor		= result.getPixel(destinationArea.x(), destinationArea.y());
	const bool			signConfig		= tcu::compareThreshold(baseColor, cellColorA, threshold);

	bool				error			= false;
	tcu::Surface		errorMask		(result.getWidth(), result.getHeight());
	std::vector<bool>	horisontalSign	(destinationArea.z() - destinationArea.x());
	std::vector<bool>	verticalSign	(destinationArea.w() - destinationArea.y());

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	// Checking only area in our destination rect

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying consistency of NEAREST filtering. Verifying rect " << m_dstRect << ".\n"
		<< "Rounding direction of the NEAREST filter at the horisontal texel edge (x = n + 0.5) should not depend on the y-coordinate.\n"
		<< "Rounding direction of the NEAREST filter at the vertical texel edge (y = n + 0.5) should not depend on the x-coordinate.\n"
		<< "Blitting a grid (with uniform sized cells) should result in a grid (with non-uniform sized cells)."
		<< tcu::TestLog::EndMessage;

	// Verify that destination only contains valid colors

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color	= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool isValidColor = tcu::compareThreshold(color, cellColorA, threshold) || tcu::compareThreshold(color, cellColorB, threshold);

		if (!isValidColor)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}
	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, destination rect contains unexpected values. "
			<< "Expected either " << cellColorA << " or " << cellColorB << "."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
		return false;
	}

	// Detect result edges by reading the first row and first column of the blitted area.
	// Blitting a grid should result in a grid-like image. ("sign changes" should be consistent)

	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x() + dx, destinationArea.y());

		if (tcu::compareThreshold(color, cellColorA, threshold))
			horisontalSign[dx] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			horisontalSign[dx] = false;
		else
			DE_ASSERT(DE_FALSE);
	}
	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	{
		const tcu::RGBA color = result.getPixel(destinationArea.x(), destinationArea.y() + dy);

		if (tcu::compareThreshold(color, cellColorA, threshold))
			verticalSign[dy] = true;
		else if (tcu::compareThreshold(color, cellColorB, threshold))
			verticalSign[dy] = false;
		else
			DE_ASSERT(DE_FALSE);
	}

	// Verify grid-like image

	for (int dy = 0; dy < destinationArea.w() - destinationArea.y(); ++dy)
	for (int dx = 0; dx < destinationArea.z() - destinationArea.x(); ++dx)
	{
		const tcu::RGBA	color		= result.getPixel(destinationArea.x() + dx, destinationArea.y() + dy);
		const bool		resultSign	= tcu::compareThreshold(cellColorA, color, threshold);
		const bool		correctSign	= (horisontalSign[dx] == verticalSign[dy]) == signConfig;

		if (resultSign != correctSign)
		{
			errorMask.setPixel(destinationArea.x() + dx, destinationArea.y() + dy, tcu::RGBA::red());
			error = true;
		}
	}

	// Report result

	if (error)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed, nearest filter is not consistent."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result",	"Result",		result)
			<< tcu::TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< tcu::TestLog::EndImageSet;
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification passed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Result", "Image verification result")
			<< tcu::TestLog::Image("Result", "Result", result)
			<< tcu::TestLog::EndImageSet;
	}

	return !error;
}